

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QGles2GraphicsPipeline::QGles2GraphicsPipeline(QGles2GraphicsPipeline *this,QRhiImplementation *rhi)

{
  QVarLengthArray<std::function<void_(QRhi_*)>,_4LL> *pQVar1;
  QRhiGraphicsPipeline *in_RSI;
  QRhiImplementation *in_RDI;
  
  QRhiGraphicsPipeline::QRhiGraphicsPipeline(in_RSI,in_RDI);
  in_RDI->_vptr_QRhiImplementation = (_func_int **)&PTR__QGles2GraphicsPipeline_00e21300;
  pQVar1 = &in_RDI[2].cleanupCallbacks;
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x28] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x29] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2a] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2b] = '\0';
  pQVar1 = &in_RDI[2].cleanupCallbacks;
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2c] = '\x04';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2d] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2e] = '\0';
  (pQVar1->super_QVLAStorage<32UL,_8UL,_4LL>).array[0x2f] = '\0';
  QVarLengthArray<QGles2UniformDescription,_8LL>::QVarLengthArray
            ((QVarLengthArray<QGles2UniformDescription,_8LL> *)
             (in_RDI[2].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x30));
  QVarLengthArray<QGles2SamplerDescription,_4LL>::QVarLengthArray
            ((QVarLengthArray<QGles2SamplerDescription,_4LL> *)
             (in_RDI[3].resUpdPool.super_QVLAStorage<8UL,_8UL,_4LL>.array + 0x18));
  in_RDI[0x42].q = (QRhi *)0x0;
  *(undefined4 *)&in_RDI[0x42].debugMarkers = 0;
  in_RDI[0x42].currentFrameSlot = 0;
  *(undefined4 *)&in_RDI[0x42].inFrame = 0;
  return;
}

Assistant:

QGles2GraphicsPipeline::QGles2GraphicsPipeline(QRhiImplementation *rhi)
    : QRhiGraphicsPipeline(rhi)
{
}